

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrVector4f *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string w_prefix;
  string z_prefix;
  string y_prefix;
  string x_prefix;
  ostringstream oss_w;
  ostringstream oss_z;
  ostringstream oss_y;
  ostringstream oss_x;
  _Alloc_hider in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  PointerToHexString<XrVector4f>((XrVector4f *)in_stack_fffffffffffff958._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&local_648,(string *)prefix);
  std::__cxx11::string::append((char *)&local_648);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(undefined8 *)
   ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)local_1a0,value->x);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_648,local_318);
  std::__cxx11::string::~string((string *)local_318);
  std::__cxx11::string::string((string *)&local_668,(string *)prefix);
  std::__cxx11::string::append((char *)&local_668);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  *(undefined8 *)
   ((long)&local_318[0]._M_string_length + *(long *)(local_318[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)local_318,value->y);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_668,local_490);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::string((string *)&local_688,(string *)prefix);
  std::__cxx11::string::append((char *)&local_688);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_490);
  *(undefined8 *)
   ((long)&local_490[0]._M_string_length + *(long *)(local_490[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)local_490,value->z);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_688,local_608);
  std::__cxx11::string::~string((string *)local_608);
  std::__cxx11::string::string((string *)&stack0xfffffffffffff958,(string *)prefix);
  std::__cxx11::string::append(&stack0xfffffffffffff958);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
  *(undefined8 *)
   ((long)&local_608[0]._M_string_length + *(long *)(local_608[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)local_608,value->w);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffff958,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff958);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_490);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::__cxx11::string::~string((string *)&local_648);
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrVector4f* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string x_prefix = prefix;
        x_prefix += "x";
        std::ostringstream oss_x;
        oss_x << std::setprecision(32) << (value->x);
        contents.emplace_back("float", x_prefix, oss_x.str());
        std::string y_prefix = prefix;
        y_prefix += "y";
        std::ostringstream oss_y;
        oss_y << std::setprecision(32) << (value->y);
        contents.emplace_back("float", y_prefix, oss_y.str());
        std::string z_prefix = prefix;
        z_prefix += "z";
        std::ostringstream oss_z;
        oss_z << std::setprecision(32) << (value->z);
        contents.emplace_back("float", z_prefix, oss_z.str());
        std::string w_prefix = prefix;
        w_prefix += "w";
        std::ostringstream oss_w;
        oss_w << std::setprecision(32) << (value->w);
        contents.emplace_back("float", w_prefix, oss_w.str());
        return true;
    } catch(...) {
    }
    return false;
}